

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void do_interrupt_all(CPUM68KState_conflict *env,int is_hw)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  uint addr;
  uint uVar7;
  target_ulong_conflict tVar8;
  abi_ptr_conflict aVar9;
  uint uVar10;
  
  uVar3 = env->pc;
  if ((env->features & 1) == 0) {
    uVar4 = uVar3;
    if (is_hw == 0) {
      uVar10 = *(uint *)(env[-3].fregs + 2);
      if (uVar10 == 0x100) {
        aVar9 = env->aregs[7];
        uVar3 = cpu_ldl_mmuidx_ra_m68k(env,aVar9,0,0);
        uVar4 = cpu_ldl_mmuidx_ra_m68k(env,aVar9 + 4,0,0);
        env->pc = uVar4;
        env->aregs[7] = (uVar3 >> 0x1c & 3 | aVar9) + 8;
LAB_006ee33a:
        cpu_m68k_set_sr_m68k(env,uVar3);
        return;
      }
      if (uVar10 == 0x101) {
        *(undefined4 *)((long)env[-3].fregs + 0x18) = 1;
        *(undefined4 *)(env[-3].fregs + 2) = 0x10001;
        cpu_loop_exit_m68k((CPUState *)(env[-0x40].fregs + 2));
      }
      uVar4 = uVar3 + 2;
      if ((uVar10 & 0xfffffff0) != 0x20) {
        uVar4 = uVar3;
      }
    }
    iVar1 = *(int *)(env[-3].fregs + 2);
    iVar6 = iVar1 * 4;
    uVar10 = env->sr;
    uVar3 = cpu_m68k_get_ccr_m68k(env);
    uVar2 = env->sr;
    env->sr = uVar2 | 0x2000;
    if (is_hw != 0) {
      env->sr = (env->pending_level & 0xffffffcfU) << 8 | uVar2 & 0xffffe8ff | 0x2000;
    }
    m68k_switch_sp_m68k(env);
    uVar2 = env->aregs[7];
    uVar7 = uVar2 & 0xfffffffc;
    cpu_stl_mmuidx_ra_m68k(env,uVar7 - 4,uVar4,0,0);
    tVar8 = uVar7 - 8;
    cpu_stl_mmuidx_ra_m68k
              (env,tVar8,iVar1 << 0x12 | uVar10 | uVar3 | (uVar2 & 3) << 0x1c | 0x40000000,0,0);
    goto LAB_006ee2d2;
  }
  if (is_hw == 0) {
    if (*(int *)(env[-3].fregs + 2) - 0x20U < 0x10) {
      uVar3 = uVar3 + 2;
    }
    else if (*(int *)(env[-3].fregs + 2) == 0x100) {
      uVar4 = env->aregs[7];
      while( true ) {
        uVar3 = cpu_lduw_mmuidx_ra_m68k(env,uVar4,0,0);
        uVar5 = cpu_ldl_mmuidx_ra_m68k(env,uVar4 + 2,0,0);
        env->pc = uVar5;
        aVar9 = uVar4 + 6;
        if ((env->features & 0x40000) == 0) break;
        uVar5 = cpu_lduw_mmuidx_ra_m68k(env,aVar9,0,0);
        uVar10 = uVar5 >> 0xc & 0xf;
        if (uVar10 != 1) {
          if (uVar10 - 2 < 2) {
            aVar9 = uVar4 + 0xc;
          }
          else if (uVar10 == 4) {
            aVar9 = uVar4 + 0x10;
          }
          else if (uVar10 == 7) {
            aVar9 = uVar4 + 0x3c;
          }
          else {
            aVar9 = uVar4 + 8;
          }
          break;
        }
        uVar4 = uVar4 + 8;
        env->aregs[7] = uVar4;
        cpu_m68k_set_sr_m68k(env,uVar3 & 0xffff);
      }
      env->aregs[7] = aVar9;
      uVar3 = uVar3 & 0xffff;
      goto LAB_006ee33a;
    }
  }
  iVar6 = *(int *)(env[-3].fregs + 2);
  uVar10 = env->sr;
  uVar4 = cpu_m68k_get_ccr_m68k(env);
  uVar10 = uVar4 | uVar10;
  uVar2 = uVar10 & 0x1fff | 0x2000;
  if (is_hw != 0) {
    uVar2 = uVar2 | env->pending_level << 8 | env->sr & 0xd8ff;
  }
  cpu_m68k_set_sr_m68k(env,uVar2 & 0xffff);
  addr = env->aregs[7] & 0xfffffffe;
  uVar7 = *(uint *)(env[-3].fregs + 2);
  switch(uVar7) {
  case 2:
    if ((env->mmu).fault == true) {
      cpu_abort_m68k((CPUState *)(env[-0x40].fregs + 2),"DOUBLE MMU FAULT\n");
    }
    (env->mmu).fault = true;
    cpu_stl_mmuidx_ra_m68k(env,addr - 4,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 8,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0xc,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x10,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x14,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x18,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x1c,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x20,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x24,(env->mmu).ar,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x28,(env->mmu).ar,0,0);
    cpu_stw_mmuidx_ra_m68k(env,addr - 0x2a,0,0,0);
    cpu_stw_mmuidx_ra_m68k(env,addr - 0x2c,0,0,0);
    cpu_stw_mmuidx_ra_m68k(env,addr - 0x2e,0,0,0);
    cpu_stw_mmuidx_ra_m68k(env,addr - 0x30,(env->mmu).ssw,0,0);
    tVar8 = addr - 0x34;
    cpu_stl_mmuidx_ra_m68k(env,tVar8,(env->mmu).ar,0,0);
    if ((env->features & 0x40000) != 0) {
      tVar8 = addr - 0x36;
      cpu_stw_mmuidx_ra_m68k(env,tVar8,*(int *)(env[-3].fregs + 2) * 4 + 0x7000,0,0);
    }
    cpu_stl_mmuidx_ra_m68k(env,tVar8 - 4,uVar3,0,0);
    tVar8 = tVar8 - 6;
    cpu_stw_mmuidx_ra_m68k(env,tVar8,uVar10 & 0xffff,0,0);
    (env->mmu).fault = false;
    break;
  case 3:
    if ((env->features & 0x40000) != 0) {
      uVar4 = 0;
LAB_006ee1a3:
      cpu_stl_mmuidx_ra_m68k(env,addr - 4,uVar4,0,0);
      addr = addr - 6;
      uVar4 = *(int *)(env[-3].fregs + 2) * 4 + 0x2000;
LAB_006ee1c4:
      cpu_stw_mmuidx_ra_m68k(env,addr,uVar4,0,0);
    }
    goto LAB_006ee1ce;
  case 4:
  case 5:
  case 6:
  case 7:
  case 9:
    if ((env->features & 0x40000) != 0) {
      uVar4 = env->pc;
      goto LAB_006ee1a3;
    }
LAB_006ee1ce:
    cpu_stl_mmuidx_ra_m68k(env,addr - 4,uVar3,0,0);
    tVar8 = addr - 6;
    cpu_stw_mmuidx_ra_m68k(env,tVar8,uVar10 & 0xffff,0,0);
    break;
  default:
    if ((uVar7 & 0xfffffff8) != 0x18 || ((uVar10 >> 0xc & 1) == 0 || is_hw == 0)) {
      if ((env->features >> 0x12 & 1) == 0) goto LAB_006ee1ce;
      addr = addr - 2;
      uVar4 = uVar7 << 2;
      goto LAB_006ee1c4;
    }
    if ((env->features >> 0x12 & 1) != 0) {
      addr = addr - 2;
      cpu_stw_mmuidx_ra_m68k(env,addr,uVar7 << 2,0,0);
    }
    cpu_stl_mmuidx_ra_m68k(env,addr - 4,uVar3,0,0);
    cpu_stw_mmuidx_ra_m68k(env,addr - 6,uVar10 & 0xffff,0,0);
    env->aregs[7] = addr - 6;
    cpu_m68k_set_sr_m68k(env,uVar2 & 0xefff);
    uVar10 = env->aregs[7] & 0xfffffffe;
    if ((env->features & 0x40000) != 0) {
      uVar10 = uVar10 - 2;
      cpu_stw_mmuidx_ra_m68k(env,uVar10,*(int *)(env[-3].fregs + 2) * 4 + 0x1000,0,0);
    }
    cpu_stl_mmuidx_ra_m68k(env,uVar10 - 4,uVar3,0,0);
    tVar8 = uVar10 - 6;
    cpu_stw_mmuidx_ra_m68k(env,tVar8,uVar2 & 0xffff,0,0);
  }
  iVar6 = iVar6 << 2;
LAB_006ee2d2:
  env->aregs[7] = tVar8;
  uVar3 = cpu_ldl_mmuidx_ra_m68k(env,iVar6 + env->vbr,0,0);
  env->pc = uVar3;
  return;
}

Assistant:

static void do_interrupt_all(CPUM68KState *env, int is_hw)
{
    if (m68k_feature(env, M68K_FEATURE_M68000)) {
        m68k_interrupt_all(env, is_hw);
        return;
    }
    cf_interrupt_all(env, is_hw);
}